

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

uint64_t mmio_read_wrapper(uc_struct_conflict15 *uc,void *opaque,hwaddr addr,uint size)

{
  mmio_cbs *cbs;
  uint size_local;
  hwaddr addr_local;
  void *opaque_local;
  uc_struct_conflict15 *uc_local;
  
  if (*opaque == 0) {
    uc_local = (uc_struct_conflict15 *)0x0;
  }
  else {
    uc_local = (uc_struct_conflict15 *)
               (**opaque)(uc,addr & 0xffffffff,size,*(undefined8 *)((long)opaque + 8));
  }
  return (uint64_t)uc_local;
}

Assistant:

static uint64_t mmio_read_wrapper(struct uc_struct *uc, void *opaque, hwaddr addr, unsigned size)
{
    mmio_cbs* cbs = (mmio_cbs*)opaque;

    // We have to care about 32bit target.
    addr = addr & ( (target_ulong)(-1) );
    if (cbs->read) {
        return cbs->read(uc, addr, size, cbs->user_data_read);
    } else {
        return 0;
    }
}